

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCapsuleShape.h
# Opt level: O1

void __thiscall
cbtCapsuleShape::getAabb
          (cbtCapsuleShape *this,cbtTransform *t,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  cbtVector3 halfExtents;
  
  iVar4 = *(int *)&(this->super_cbtConvexInternalShape).field_0x44;
  halfExtents.m_floats[0] =
       (this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats[(iVar4 + 2) % 3];
  halfExtents.m_floats[1] = halfExtents.m_floats[0];
  halfExtents.m_floats[2] = halfExtents.m_floats[0];
  halfExtents.m_floats[iVar4] =
       halfExtents.m_floats[0] +
       (this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats[iVar4];
  auVar13._8_4_ = 0x7fffffff;
  auVar13._0_8_ = 0x7fffffff7fffffff;
  auVar13._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[0].m_floats[0]),auVar13);
  auVar6 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[0].m_floats[1]),auVar13);
  auVar7 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[0].m_floats[2]),auVar13);
  auVar8 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[1].m_floats[0]),auVar13);
  auVar9 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[1].m_floats[1]),auVar13);
  auVar10 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[1].m_floats[2]),auVar13);
  auVar11 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[2].m_floats[0]),auVar13);
  auVar12 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[2].m_floats[1]),auVar13);
  auVar13 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[2].m_floats[2]),auVar13);
  fVar1 = (t->m_origin).m_floats[0];
  fVar2 = (t->m_origin).m_floats[1];
  fVar3 = (t->m_origin).m_floats[2];
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(halfExtents.m_floats[1] * auVar6._0_4_)),
                           ZEXT416((uint)halfExtents.m_floats[0]),auVar5);
  auVar6 = vfmadd231ss_fma(auVar5,ZEXT416((uint)halfExtents.m_floats[2]),auVar7);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(halfExtents.m_floats[1] * auVar9._0_4_)),
                           ZEXT416((uint)halfExtents.m_floats[0]),auVar8);
  auVar7 = vfmadd231ss_fma(auVar5,ZEXT416((uint)halfExtents.m_floats[2]),auVar10);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * halfExtents.m_floats[1])),
                           ZEXT416((uint)halfExtents.m_floats[0]),auVar11);
  auVar8 = vfmadd231ss_fma(auVar5,ZEXT416((uint)halfExtents.m_floats[2]),auVar13);
  auVar5 = vinsertps_avx(ZEXT416((uint)(fVar1 - auVar6._0_4_)),ZEXT416((uint)(fVar2 - auVar7._0_4_))
                         ,0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)(fVar3 - auVar8._0_4_)),0x28);
  *(undefined1 (*) [16])aabbMin->m_floats = auVar5;
  auVar5 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar6._0_4_)),ZEXT416((uint)(fVar2 + auVar7._0_4_))
                         ,0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)(fVar3 + auVar8._0_4_)),0x28);
  *(undefined1 (*) [16])aabbMax->m_floats = auVar5;
  return;
}

Assistant:

cbtScalar getRadius() const
	{
		int radiusAxis = (m_upAxis + 2) % 3;
		return m_implicitShapeDimensions[radiusAxis];
	}